

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.h
# Opt level: O2

bool senjo::NumberParam<int>(string *name,int *value,char **params,bool *invalid)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  int iVar4;
  
  bVar2 = ParamMatch(name,params);
  if (!bVar2) {
    return bVar2;
  }
  pcVar3 = *params;
  if ((pcVar3 != (char *)0x0) && ((int)*pcVar3 - 0x30U < 10)) {
    *params = pcVar3 + 1;
    iVar4 = (int)*pcVar3;
    pcVar3 = pcVar3 + 1;
    while( true ) {
      *value = iVar4 + -0x30;
      cVar1 = *pcVar3;
      if (9 < (int)cVar1 - 0x30U) break;
      *params = pcVar3 + 1;
      iVar4 = (iVar4 + -0x30) * 10 + (int)*pcVar3;
      pcVar3 = pcVar3 + 1;
    }
    if ((cVar1 == '\0') || (iVar4 = isspace((int)cVar1), iVar4 != 0)) {
      NextWord(params);
      return bVar2;
    }
  }
  *invalid = true;
  return bVar2;
}

Assistant:

static inline bool NumberParam(const std::string& name, Number& value,
                               const char*& params, bool& invalid)
{
  if (!ParamMatch(name, params)) {
    return false;
  }
  if (!params || !*params || !isdigit(*params)) {
    invalid = true;
  }
  else {
    value = (*params++ - '0');
    while (*params && isdigit(*params)) {
      value = ((10 * value) + (*params++ - '0'));
    }
    if (*params && !isspace(*params)) {
      invalid = true;
    }
    else {
      NextWord(params);
    }
  }
  return true;
}